

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O0

int __thiscall zmq::dish_t::xjoin(dish_t *this,char *group_)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  char *errstr_2;
  int rc2;
  int err;
  char *errstr_1;
  char *errstr;
  int rc;
  msg_t msg;
  string group;
  msg_t *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  undefined8 *puVar7;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  value_type *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  int local_cc;
  msg_t local_b0;
  _Base_ptr local_70;
  byte local_68;
  _Base_ptr local_60;
  byte local_58;
  undefined4 local_50;
  allocator<char> local_39;
  string local_38 [52];
  int local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_ffffffffffffff08,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::~allocator(&local_39);
  uVar3 = std::__cxx11::string::length();
  if (uVar3 < 0x100) {
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
    local_70 = (_Base_ptr)pVar6.first._M_node;
    local_68 = pVar6.second;
    local_60 = local_70;
    local_58 = local_68;
    if (((local_68 ^ 0xff) & 1) == 0) {
      iVar1 = msg_t::init_join(&local_b0);
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x6f);
        fflush(_stderr);
        zmq_abort((char *)0x21e4e9);
      }
      iVar1 = msg_t::set_group((msg_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ),in_stack_fffffffffffffed8);
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        puVar7 = (undefined8 *)&stderr;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x72);
        fflush((FILE *)*puVar7);
        zmq_abort((char *)0x21e583);
      }
      local_cc = 0;
      iVar1 = (int)&local_b0;
      iVar2 = dist_t::send_to_all((dist_t *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  in_stack_fffffffffffffec8);
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        local_cc = *piVar4;
      }
      iVar1 = msg_t::close(&local_b0,iVar1);
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        puVar7 = (undefined8 *)&stderr;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x79);
        fflush((FILE *)*puVar7);
        zmq_abort((char *)0x21e656);
      }
      local_4 = iVar2;
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        *piVar4 = local_cc;
      }
    }
    else {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      local_4 = -1;
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    local_4 = -1;
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int zmq::dish_t::xjoin (const char *group_)
{
    const std::string group = std::string (group_);

    if (group.length () > ZMQ_GROUP_MAX_LENGTH) {
        errno = EINVAL;
        return -1;
    }

    //  User cannot join same group twice
    if (!_subscriptions.insert (group).second) {
        errno = EINVAL;
        return -1;
    }

    msg_t msg;
    int rc = msg.init_join ();
    errno_assert (rc == 0);

    rc = msg.set_group (group_);
    errno_assert (rc == 0);

    int err = 0;
    rc = _dist.send_to_all (&msg);
    if (rc != 0)
        err = errno;
    const int rc2 = msg.close ();
    errno_assert (rc2 == 0);
    if (rc != 0)
        errno = err;
    return rc;
}